

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelXRow_C(uint8_t *src_y0,uint8_t *src_y1,uint8_t *src_y2,uint8_t *dst_sobelx,int width)

{
  uint32_t v;
  int32_t iVar1;
  long in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int sobel;
  int c_diff;
  int b_diff;
  int a_diff;
  int c_sub;
  int b_sub;
  int a_sub;
  int c;
  int b;
  int a;
  int i;
  undefined4 local_28;
  
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    v = libyuv::Abs(((uint)*(byte *)(in_RDI + local_28) - (uint)*(byte *)(in_RDI + (local_28 + 2)))
                    + ((uint)*(byte *)(in_RSI + local_28) - (uint)*(byte *)(in_RSI + (local_28 + 2))
                      ) * 2 + ((uint)*(byte *)(CONCAT71(in_register_00000011,in_DL) + (long)local_28
                                              ) -
                              (uint)*(byte *)(CONCAT71(in_register_00000011,in_DL) +
                                             (long)(local_28 + 2))));
    iVar1 = libyuv::clamp255(v);
    *(char *)(in_RCX + local_28) = (char)iVar1;
  }
  return;
}

Assistant:

void SobelXRow_C(const uint8_t* src_y0,
                 const uint8_t* src_y1,
                 const uint8_t* src_y2,
                 uint8_t* dst_sobelx,
                 int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int a = src_y0[i];
    int b = src_y1[i];
    int c = src_y2[i];
    int a_sub = src_y0[i + 2];
    int b_sub = src_y1[i + 2];
    int c_sub = src_y2[i + 2];
    int a_diff = a - a_sub;
    int b_diff = b - b_sub;
    int c_diff = c - c_sub;
    int sobel = Abs(a_diff + b_diff * 2 + c_diff);
    dst_sobelx[i] = (uint8_t)(clamp255(sobel));
  }
}